

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAddiEa<(moira::Instr)6,(moira::Mode)5,(moira::Size)4>(Moira *this,u16 opcode)

{
  u16 uVar1;
  u16 uVar2;
  byte bVar3;
  u32 addr;
  u32 uVar4;
  bool bVar5;
  ulong uVar6;
  bool error;
  bool local_29;
  
  uVar1 = (this->queue).irc;
  readExt(this);
  uVar2 = (this->queue).irc;
  readExt(this);
  addr = computeEA<(moira::Mode)5,(moira::Size)4,0ul>(this,opcode & 7);
  uVar4 = readM<(moira::MemSpace)1,(moira::Size)4,128ul>(this,addr,&local_29);
  if (local_29 == false) {
    uVar6 = (ulong)uVar4 + (ulong)CONCAT22(uVar1,uVar2);
    bVar5 = SUB81(uVar6 >> 0x20,0);
    (this->reg).sr.c = bVar5;
    (this->reg).sr.x = bVar5;
    bVar3 = (byte)(uVar6 >> 0x18);
    (this->reg).sr.v =
         (bool)((byte)(((byte)(uVar4 >> 0x18) ^ bVar3) & ((byte)(uVar1 >> 8) ^ bVar3)) >> 7);
    (this->reg).sr.z = (uint)uVar6 == 0;
    (this->reg).sr.n = (bool)((byte)(uVar6 >> 0x1f) & 1);
    uVar4 = (this->reg).pc;
    (this->reg).pc0 = uVar4;
    (this->queue).ird = (this->queue).irc;
    uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar4 + 2);
    (this->queue).irc = (u16)uVar4;
    writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,addr,(uint)(uVar6 >> 0x10) & 0xffff);
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,addr + 2,(uint)uVar6 & 0xffff);
  }
  return;
}

Assistant:

void
Moira::execAddiEa(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 ea, data, result;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    result = addsub<I,S>(src, data);
    prefetch();

    writeOp<M,S, POLLIPL>(dst, ea, result);
}